

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt.c
# Opt level: O2

void gga_x_vmt_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined4 *)malloc(0x10);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x47) {
    uVar3 = 0xe80c25e;
    uVar4 = 0x3fcc1911;
    uVar5 = 0x757d5a9f;
    uVar6 = 0x3f66a055;
  }
  else {
    if (iVar1 != 0x46) {
      fwrite("Internal error in gga_x_vmt\n",0x1c,1,_stderr);
      exit(1);
    }
    uVar3 = 0x3c0ca458;
    uVar4 = 0x3fbf9add;
    uVar5 = 0xd7be985;
    uVar6 = 0x3f5971c1;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  return;
}

Assistant:

static void
gga_x_vmt_init(xc_func_type *p)
{
  gga_x_vmt_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt_params));
  params = (gga_x_vmt_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.002762;
    break;
  case XC_GGA_X_VMT_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.001553;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt\n");
    exit(1);
  }
}